

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall cmCustomCommandGenerator::GetDepends_abi_cxx11_(cmCustomCommandGenerator *this)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  char *pcVar2;
  pointer pbVar3;
  string *in_relative;
  allocator local_c1;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  undefined1 local_98 [32];
  string local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  
  if (this->DependsDone == false) {
    this->DependsDone = true;
    __x = cmCustomCommand::GetDepends_abi_cxx11_(this->CC);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&depends,__x);
    if (depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_50 = &this->Config;
      local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Depends
      ;
      pbVar3 = depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmGeneratorExpression::Parse((cmGeneratorExpression *)local_98,(string *)this->GE);
        cge.x_ = (cmCompiledGeneratorExpression *)local_98._0_8_;
        local_98._0_8_ = (cmCompiledGeneratorExpression *)0x0;
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)local_98);
        result.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        result.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        result.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar2 = cmCompiledGeneratorExpression::Evaluate
                           (cge.x_,this->Makefile,local_50,false,(cmTarget *)0x0,(cmTarget *)0x0,
                            (cmGeneratorExpressionDAGChecker *)0x0,&local_78);
        std::__cxx11::string::string((string *)local_98,pcVar2,&local_c1);
        cmSystemTools::ExpandListArgument((string *)local_98,&result,false);
        if ((cmCompiledGeneratorExpression *)local_98._0_8_ !=
            (cmCompiledGeneratorExpression *)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
        in_relative = result.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
          in_relative = result.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; in_relative !=
               result.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; in_relative = in_relative + 1) {
          bVar1 = cmsys::SystemTools::FileIsFullPath((in_relative->_M_dataplus)._M_p);
          if (bVar1) {
            cmsys::SystemTools::CollapseFullPath((string *)local_98,in_relative);
            std::__cxx11::string::operator=((string *)in_relative,(string *)local_98);
            if ((cmCompiledGeneratorExpression *)local_98._0_8_ !=
                (cmCompiledGeneratorExpression *)(local_98 + 0x10)) {
              operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
            }
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_58,(this->Depends).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                   result.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&result);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != depends.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
  }
  return &this->Depends;
}

Assistant:

std::vector<std::string> const& cmCustomCommandGenerator::GetDepends() const
{
  if (!this->DependsDone)
    {
    this->DependsDone = true;
    std::vector<std::string> depends = this->CC.GetDepends();
    for(std::vector<std::string>::const_iterator
          i = depends.begin();
        i != depends.end(); ++i)
      {
      cmsys::auto_ptr<cmCompiledGeneratorExpression> cge
                                              = this->GE->Parse(*i);
      std::vector<std::string> result;
      cmSystemTools::ExpandListArgument(
                  cge->Evaluate(this->Makefile, this->Config), result);
      for (std::vector<std::string>::iterator it = result.begin();
          it != result.end(); ++it)
        {
        if (cmSystemTools::FileIsFullPath(it->c_str()))
          {
          *it = cmSystemTools::CollapseFullPath(*it);
          }
        }
      this->Depends.insert(this->Depends.end(), result.begin(), result.end());
      }
    }
  return this->Depends;
}